

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiAnalyzerResults.cpp
# Opt level: O0

void __thiscall
MidiAnalyzerResults::results(MidiAnalyzerResults *this,MidiFrameType mFrameType,stash mStash1)

{
  char local_8c8 [8];
  char number_str [128];
  S8 channel;
  int nchars;
  int charsPrinted;
  int size;
  char buffer [1024];
  char channelNum [1024];
  char *frameType;
  char *result;
  MidiFrameType mFrameType_local;
  MidiAnalyzerResults *this_local;
  stash mStash1_local;
  
  this_local._0_1_ = mStash1.channel;
  number_str[0x7b] = (S8)this_local;
  AnalyzerHelpers::GetNumberString
            (*(ulonglong *)&this->field_0x30,this->localDisplay_base,8,local_8c8,0x80);
  switch(mFrameType) {
  case Command:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"Command Channel: %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"Com Ch %i [%s]",(ulong)(uint)(int)number_str[0x7b],
                  local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"C",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case Data:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"Data Channel: %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"Data Ch %i [%s]",(ulong)(uint)(int)number_str[0x7b],
                  local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"D",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case NoteOff:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"NoteOff Channel: %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"NOff Chan %i [%s]",(ulong)(uint)(int)number_str[0x7b]
                  ,local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"NOff",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"N",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case NoteOn:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"NoteOn Channel: %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"NOn Chan %i [%s]",(ulong)(uint)(int)number_str[0x7b],
                  local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"NOn",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"N",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case Aftertouch:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"Aftertouch Channel: %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"Aft Chan %i [%s]",(ulong)(uint)(int)number_str[0x7b],
                  local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"Aft",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"A",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case ContinuousController:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"ContinuousController Channel: %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"ContinuControl Chan %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"ContinuControl",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"CC",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"C",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case PatchChange:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"PatchChange Channel: %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"P_Ch Chan %i [%s]",(ulong)(uint)(int)number_str[0x7b]
                  ,local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"PCh",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"P",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case ChannelPressure:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"ChannelPressure Channel: %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"ChanPres Chan %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"ChanPres",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"C",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case PitchBend:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"PitchBend Channel: %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"PitchB Chan %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"PitchB",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"P",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case Key:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"Key Channel: %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"Key",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"K",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case Velocity:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"Velocity Channel: %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"Velocity",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"V",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case Touch:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"Touch Channel: %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"Touch",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"T",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case ControllerNum:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"ControllerNum Channel: %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"ControllerNum",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"CN",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case ControllerValue:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"ControllerValue Channel: %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"ControllerValue",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"CV",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case InstrumentNum:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"InstrumentNum Channel: %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"InstrumentNum",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"IN",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case Pressure:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"Pressure Channel: %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"Pressure",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"P",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case LSB:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"LSB Channel: %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"LSB",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"L",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case MSB:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"MSB Channel: %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"MSB",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"M",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case orphanedData:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"orphanedData Channel: %i [%s]",
                  (ulong)(uint)(int)number_str[0x7b],local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"orphanedData",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"o",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case BeginSystemExclusiveMessage:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"BeginSystemExclusiveMessage  [%s]",local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"BegSystemExclMessage  [%s]",local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"BegSystemExclMessage",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"SysExclMes",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"SysEx",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"SE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case MIDITimeCodeQuarterFrame:
    number_str._124_4_ =
         snprintf((char *)&charsPrinted,0x400,"MIDITimeCodeQuarterFrame  [%s]",local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    number_str._124_4_ = snprintf((char *)&charsPrinted,0x400,"TimeCodeQuarFr  [%s]",local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"TimeCodeQuarFr",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"QuarFr",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"QF",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case SongPositionPointer:
    number_str._124_4_ = snprintf((char *)&charsPrinted,0x400,"SongPositionPointer  [%s]",local_8c8)
    ;
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    number_str._124_4_ = snprintf((char *)&charsPrinted,0x400,"SongPosPoint  [%s]",local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"SongPosPoint",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"SongPos",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"SPP",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"SP",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case SongSelect:
    number_str._124_4_ = snprintf((char *)&charsPrinted,0x400,"SongSelect  [%s]",local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    number_str._124_4_ = snprintf((char *)&charsPrinted,0x400,"SongSel  [%s]",local_8c8);
    if (((int)number_str._124_4_ < 0) || (0x3ff < (int)number_str._124_4_)) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&charsPrinted,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
    }
    AnalyzerResults::AddResultString
              ((char *)this,"SongSel",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"SoSel",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"SS",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case F4:
    number_str._124_4_ = sprintf(buffer + 0x3f8,"F4  [%s]",local_8c8);
    if ((int)number_str._124_4_ < 0) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,buffer + 0x3f8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    AnalyzerResults::AddResultString
              ((char *)this,"4",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case F5:
    number_str._124_4_ = sprintf(buffer + 0x3f8,"F5  [%s]",local_8c8);
    if ((int)number_str._124_4_ < 0) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,buffer + 0x3f8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    AnalyzerResults::AddResultString
              ((char *)this,"5",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case TuneRequest:
    number_str._124_4_ = sprintf(buffer + 0x3f8,"TuneRequest  [%s]",local_8c8);
    if ((int)number_str._124_4_ < 0) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,buffer + 0x3f8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    AnalyzerResults::AddResultString
              ((char *)this,"TuneReq",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Tune",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"T",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case EndSystemExclusiveMessage:
    number_str._124_4_ = sprintf(buffer + 0x3f8,"EndSystemExclusiveMessage  [%s]",local_8c8);
    if ((int)number_str._124_4_ < 0) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,buffer + 0x3f8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    AnalyzerResults::AddResultString
              ((char *)this,"EndSystemExcMess",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"EndSysExc",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"ESEM",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"ES",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case TimingClock:
    number_str._124_4_ = sprintf(buffer + 0x3f8,"TimingClock  [%s]",local_8c8);
    if ((int)number_str._124_4_ < 0) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,buffer + 0x3f8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    AnalyzerResults::AddResultString
              ((char *)this,"TimClk",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"TiCl",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"TC",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case F9:
    number_str._124_4_ = sprintf(buffer + 0x3f8,"F9  [%s]",local_8c8);
    if ((int)number_str._124_4_ < 0) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,buffer + 0x3f8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    AnalyzerResults::AddResultString
              ((char *)this,"9",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case Start_:
    number_str._124_4_ = sprintf(buffer + 0x3f8,"Start  [%s]",local_8c8);
    if ((int)number_str._124_4_ < 0) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,buffer + 0x3f8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    AnalyzerResults::AddResultString
              ((char *)this,"Sta",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"S",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case Continue:
    number_str._124_4_ = sprintf(buffer + 0x3f8,"Continue  [%s]",local_8c8);
    if ((int)number_str._124_4_ < 0) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,buffer + 0x3f8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    AnalyzerResults::AddResultString
              ((char *)this,"Cont",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"C",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case Stop_:
    number_str._124_4_ = sprintf(buffer + 0x3f8,"Stop  [%s]",local_8c8);
    if ((int)number_str._124_4_ < 0) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,buffer + 0x3f8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    AnalyzerResults::AddResultString
              ((char *)this,"St",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"S",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case FD:
    number_str._124_4_ = sprintf(buffer + 0x3f8,"FD  [%s]",local_8c8);
    if ((int)number_str._124_4_ < 0) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,buffer + 0x3f8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    AnalyzerResults::AddResultString
              ((char *)this,"D",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case ActiveSensing:
    number_str._124_4_ = sprintf(buffer + 0x3f8,"ActiveSensing  [%s]",local_8c8);
    if ((int)number_str._124_4_ < 0) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,buffer + 0x3f8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    AnalyzerResults::AddResultString
              ((char *)this,"ActSens",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"AS",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case SystemReset:
    number_str._124_4_ = sprintf(buffer + 0x3f8,"SystemReset  [%s]",local_8c8);
    if ((int)number_str._124_4_ < 0) {
      AnalyzerResults::AddResultString
                ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,buffer + 0x3f8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    AnalyzerResults::AddResultString
              ((char *)this,"SysRes",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"SR",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case error:
    AnalyzerResults::AddResultString
              ((char *)this,"Error",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Err",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"E",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  default:
    AnalyzerResults::AddResultString
              ((char *)this,"Internal Error, no match",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Internal Error",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"IntErr",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"IE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  return;
}

Assistant:

void MidiAnalyzerResults::results( enum MidiFrameType mFrameType, union stash mStash1 )
{
    char* result = NULL;
    char* frameType = NULL;
    // char * channelNum = NULL;
    char channelNum[ 1024 ];
    char buffer[ 1024 ];
    const int size = 1024;
    int charsPrinted;
    int nchars;
    S8 channel = mStash1.channel;

    char number_str[ 128 ];
    AnalyzerHelpers::GetNumberString( localFrame.mData1, localDisplay_base, 8, number_str, 128 );

    // Makes a string describing the message type (data, command, what command).
    switch( mFrameType )
    {
    case Command:
        nchars = snprintf( buffer, size, "Command Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "Com Ch %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "C" );
        break;
    case Data:
        nchars = snprintf( buffer, size, "Data Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "Data Ch %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "D" );
        break;
    // End misc
    // Start data
    case Key:
        nchars = snprintf( buffer, size, "Key Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "Key" );
        AddResultString( "K" );
        break;
    case Velocity:
        nchars = snprintf( buffer, size, "Velocity Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "Velocity" );
        AddResultString( "V" );
        break;
    case Touch:
        nchars = snprintf( buffer, size, "Touch Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "Touch" );
        AddResultString( "T" );
        break;
    case ControllerNum:
        nchars = snprintf( buffer, size, "ControllerNum Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "ControllerNum" );
        AddResultString( "CN" );
        break;
    case ControllerValue:
        nchars = snprintf( buffer, size, "ControllerValue Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "ControllerValue" );
        AddResultString( "CV" );
        break;
    case InstrumentNum:
        nchars = snprintf( buffer, size, "InstrumentNum Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "InstrumentNum" );
        AddResultString( "IN" );
        break;
    case Pressure:
        nchars = snprintf( buffer, size, "Pressure Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "Pressure" );
        AddResultString( "P" );
        break;
    case LSB:
        nchars = snprintf( buffer, size, "LSB Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "LSB" );
        AddResultString( "L" );
        break;
    case MSB:
        nchars = snprintf( buffer, size, "MSB Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "MSB" );
        AddResultString( "M" );
        break;
    case orphanedData:
        nchars = snprintf( buffer, size, "orphanedData Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "orphanedData" );
        AddResultString( "o" );
        break;
    // End data
    // Start commands
    case NoteOff:
        nchars = snprintf( buffer, size, "NoteOff Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "NOff Chan %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "NOff" );
        AddResultString( "N" );
        break;
    case NoteOn:
        nchars = snprintf( buffer, size, "NoteOn Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "NOn Chan %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "NOn" );
        AddResultString( "N" );
        break;
    case Aftertouch:
        nchars = snprintf( buffer, size, "Aftertouch Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "Aft Chan %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "Aft" );
        AddResultString( "A" );
        break;
    case ContinuousController:
        nchars = snprintf( buffer, size, "ContinuousController Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "ContinuControl Chan %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "ContinuControl" );
        AddResultString( "CC" );
        AddResultString( "C" );
        break;
    case PatchChange:
        nchars = snprintf( buffer, size, "PatchChange Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "P_Ch Chan %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "PCh" );
        AddResultString( "P" );
        break;
    case ChannelPressure:
        nchars = snprintf( buffer, size, "ChannelPressure Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "ChanPres Chan %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "ChanPres" );
        AddResultString( "C" );
        break;
    case PitchBend:
        nchars = snprintf( buffer, size, "PitchBend Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "PitchB Chan %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "PitchB" );
        AddResultString( "P" );
        break;
    // End commands
    // Start non-musical commands.  They do not have channels.
    case BeginSystemExclusiveMessage:
        nchars = snprintf( buffer, size, "BeginSystemExclusiveMessage  [%s]", number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "BegSystemExclMessage  [%s]", number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "BegSystemExclMessage" );
        AddResultString( "SysExclMes" );
        AddResultString( "SysEx" );
        AddResultString( "SE" );
        break;
    case MIDITimeCodeQuarterFrame:
        nchars = snprintf( buffer, size, "MIDITimeCodeQuarterFrame  [%s]", number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "TimeCodeQuarFr  [%s]", number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "TimeCodeQuarFr" );
        AddResultString( "QuarFr" );
        AddResultString( "QF" );
        break;
    case SongPositionPointer:
        nchars = snprintf( buffer, size, "SongPositionPointer  [%s]", number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "SongPosPoint  [%s]", number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "SongPosPoint" );
        AddResultString( "SongPos" );
        AddResultString( "SPP" );
        AddResultString( "SP" );
        break;
    case SongSelect:
        nchars = snprintf( buffer, size, "SongSelect  [%s]", number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "SongSel  [%s]", number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "SongSel" );
        AddResultString( "SoSel" );
        AddResultString( "SS" );
        break;
    case F4:
        nchars = sprintf( channelNum, "F4  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "4" );
        break;
    case F5:
        nchars = sprintf( channelNum, "F5  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "5" );
        break;
    case TuneRequest:
        nchars = sprintf( channelNum, "TuneRequest  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "TuneReq" );
        AddResultString( "Tune" );
        AddResultString( "T" );
        break;
    case EndSystemExclusiveMessage:
        nchars = sprintf( channelNum, "EndSystemExclusiveMessage  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "EndSystemExcMess" );
        AddResultString( "EndSysExc" );
        AddResultString( "ESEM" );
        AddResultString( "ES" );
        break;
    case TimingClock:
        nchars = sprintf( channelNum, "TimingClock  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "TimClk" );
        AddResultString( "TiCl" );
        AddResultString( "TC" );
        break;
    case F9:
        nchars = sprintf( channelNum, "F9  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "9" );
        break;
    case Start_:
        nchars = sprintf( channelNum, "Start  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "Sta" );
        AddResultString( "S" );
        break;
    case Continue:
        nchars = sprintf( channelNum, "Continue  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "Cont" );
        AddResultString( "C" );
        break;
    case Stop_:
        nchars = sprintf( channelNum, "Stop  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "St" );
        AddResultString( "S" );
        break;
    case FD:
        nchars = sprintf( channelNum, "FD  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "D" );
        break;
    case ActiveSensing:
        nchars = sprintf( channelNum, "ActiveSensing  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "ActSens" );
        AddResultString( "AS" );
        break;
    case SystemReset:
        nchars = sprintf( channelNum, "SystemReset  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "SysRes" );
        AddResultString( "SR" );
        break;
    // non-musical commands
    // Start errors
    case error:
        AddResultString( "Error" );
        AddResultString( "Err" );
        AddResultString( "E" );
        break;
    default:
        AddResultString( "Internal Error, no match" );
        AddResultString( "Internal Error" );
        AddResultString( "IntErr" );
        AddResultString( "IE" );
        break;
    }
    //	Command, Data,
    //	NoteOff, NoteOn, Aftertouch, ContinuousController, PatchChange, ChannelPressure, PitchBend,
    //	BeginSystemExclusiveMessage, MIDITimeCodeQuarterFrame, SongPositionPointer, SongSelect, F4, F5, TuneRequest,
    // EndSystemExclusiveMessage, 	TimingClock, Start, Continue, Stop, FD, ActiveSensing, SystemReset
}